

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# erase_if_test.cc
# Opt level: O2

void __thiscall
phmap::priv::anon_unknown_0::EraseIf_FlatHashSet_uint32_Test::TestBody
          (EraseIf_FlatHashSet_uint32_Test *this)

{
  size_t sVar1;
  AssertionResult *eq;
  key_equal *eq_00;
  ctrl_t *pcVar2;
  bool bVar3;
  iterator it;
  iterator it_00;
  AssertHelper local_c8;
  AssertHelper local_c0;
  AssertionResult gtest_ar__1;
  AssertionResult gtest_ar_;
  int local_98 [4];
  flat_hash_set<unsigned_int,_phmap::Hash<unsigned_int>,_phmap::EqualTo<unsigned_int>,_std::allocator<unsigned_int>_>
  st2;
  flat_hash_set<unsigned_int,_phmap::Hash<unsigned_int>,_phmap::EqualTo<unsigned_int>,_std::allocator<unsigned_int>_>
  st1;
  
  st2.
  super_raw_hash_set<phmap::priv::FlatHashSetPolicy<unsigned_int>,_phmap::Hash<unsigned_int>,_phmap::EqualTo<unsigned_int>,_std::allocator<unsigned_int>_>
  .slots_ = (slot_type *)0x900000007;
  st2.
  super_raw_hash_set<phmap::priv::FlatHashSetPolicy<unsigned_int>,_phmap::Hash<unsigned_int>,_phmap::EqualTo<unsigned_int>,_std::allocator<unsigned_int>_>
  .ctrl_ = (ctrl_t *)0x600000003;
  eq = &gtest_ar__1;
  raw_hash_set<phmap::priv::FlatHashSetPolicy<unsigned_int>,phmap::Hash<unsigned_int>,phmap::EqualTo<unsigned_int>,std::allocator<unsigned_int>>
  ::raw_hash_set<int_const*>
            ((raw_hash_set<phmap::priv::FlatHashSetPolicy<unsigned_int>,phmap::Hash<unsigned_int>,phmap::EqualTo<unsigned_int>,std::allocator<unsigned_int>>
              *)&st1.
                 super_raw_hash_set<phmap::priv::FlatHashSetPolicy<unsigned_int>,_phmap::Hash<unsigned_int>,_phmap::EqualTo<unsigned_int>,_std::allocator<unsigned_int>_>
             ,(int *)&st2,
             (int *)&st2.
                     super_raw_hash_set<phmap::priv::FlatHashSetPolicy<unsigned_int>,_phmap::Hash<unsigned_int>,_phmap::EqualTo<unsigned_int>,_std::allocator<unsigned_int>_>
                     .size_,0,(hasher *)&gtest_ar_,(key_equal *)eq,(allocator_type *)&local_c8);
  sVar1 = st1.
          super_raw_hash_set<phmap::priv::FlatHashSetPolicy<unsigned_int>,_phmap::Hash<unsigned_int>,_phmap::EqualTo<unsigned_int>,_std::allocator<unsigned_int>_>
          .size_;
  st2.
  super_raw_hash_set<phmap::priv::FlatHashSetPolicy<unsigned_int>,_phmap::Hash<unsigned_int>,_phmap::EqualTo<unsigned_int>,_std::allocator<unsigned_int>_>
  ._0_16_ = raw_hash_set<phmap::priv::FlatHashSetPolicy<unsigned_int>,_phmap::Hash<unsigned_int>,_phmap::EqualTo<unsigned_int>,_std::allocator<unsigned_int>_>
            ::begin(&st1.
                     super_raw_hash_set<phmap::priv::FlatHashSetPolicy<unsigned_int>,_phmap::Hash<unsigned_int>,_phmap::EqualTo<unsigned_int>,_std::allocator<unsigned_int>_>
                   );
  while (st2.
         super_raw_hash_set<phmap::priv::FlatHashSetPolicy<unsigned_int>,_phmap::Hash<unsigned_int>,_phmap::EqualTo<unsigned_int>,_std::allocator<unsigned_int>_>
         .ctrl_ != st1.
                   super_raw_hash_set<phmap::priv::FlatHashSetPolicy<unsigned_int>,_phmap::Hash<unsigned_int>,_phmap::EqualTo<unsigned_int>,_std::allocator<unsigned_int>_>
                   .ctrl_ + st1.
                            super_raw_hash_set<phmap::priv::FlatHashSetPolicy<unsigned_int>,_phmap::Hash<unsigned_int>,_phmap::EqualTo<unsigned_int>,_std::allocator<unsigned_int>_>
                            .capacity_) {
    if (*st2.
         super_raw_hash_set<phmap::priv::FlatHashSetPolicy<unsigned_int>,_phmap::Hash<unsigned_int>,_phmap::EqualTo<unsigned_int>,_std::allocator<unsigned_int>_>
         .slots_ < 7) {
      raw_hash_set<phmap::priv::FlatHashSetPolicy<unsigned_int>,_phmap::Hash<unsigned_int>,_phmap::EqualTo<unsigned_int>,_std::allocator<unsigned_int>_>
      ::iterator::operator++((iterator *)&st2);
    }
    else {
      it.field_1.slot_ =
           st2.
           super_raw_hash_set<phmap::priv::FlatHashSetPolicy<unsigned_int>,_phmap::Hash<unsigned_int>,_phmap::EqualTo<unsigned_int>,_std::allocator<unsigned_int>_>
           .slots_;
      it.ctrl_ = st2.
                 super_raw_hash_set<phmap::priv::FlatHashSetPolicy<unsigned_int>,_phmap::Hash<unsigned_int>,_phmap::EqualTo<unsigned_int>,_std::allocator<unsigned_int>_>
                 .ctrl_;
      st2.
      super_raw_hash_set<phmap::priv::FlatHashSetPolicy<unsigned_int>,_phmap::Hash<unsigned_int>,_phmap::EqualTo<unsigned_int>,_std::allocator<unsigned_int>_>
      ._0_16_ = raw_hash_set<phmap::priv::FlatHashSetPolicy<unsigned_int>,_phmap::Hash<unsigned_int>,_phmap::EqualTo<unsigned_int>,_std::allocator<unsigned_int>_>
                ::erase(&st1.
                         super_raw_hash_set<phmap::priv::FlatHashSetPolicy<unsigned_int>,_phmap::Hash<unsigned_int>,_phmap::EqualTo<unsigned_int>,_std::allocator<unsigned_int>_>
                        ,it);
    }
  }
  bVar3 = sVar1 - st1.
                  super_raw_hash_set<phmap::priv::FlatHashSetPolicy<unsigned_int>,_phmap::Hash<unsigned_int>,_phmap::EqualTo<unsigned_int>,_std::allocator<unsigned_int>_>
                  .size_ == 2;
  gtest_ar_._1_7_ = gtest_ar_._1_7_;
  gtest_ar_.success_ = bVar3;
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )0x0;
  if (!bVar3) {
    testing::Message::Message((Message *)&gtest_ar__1);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&st2,(internal *)&gtest_ar_,(AssertionResult *)"num_erased == 2","false",
               "true",&eq->success_);
    testing::internal::AssertHelper::AssertHelper
              (&local_c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/erase_if_test.cc"
               ,0xe,st2.
                    super_raw_hash_set<phmap::priv::FlatHashSetPolicy<unsigned_int>,_phmap::Hash<unsigned_int>,_phmap::EqualTo<unsigned_int>,_std::allocator<unsigned_int>_>
                    .ctrl_);
    testing::internal::AssertHelper::operator=(&local_c8,(Message *)&gtest_ar__1);
    testing::internal::AssertHelper::~AssertHelper(&local_c8);
    std::__cxx11::string::~string((string *)&st2);
    if ((long *)CONCAT71(gtest_ar__1._1_7_,gtest_ar__1.success_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(gtest_ar__1._1_7_,gtest_ar__1.success_) + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_.message_);
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )0x600000003;
  gtest_ar_._0_8_ = 0x200000000;
  eq_00 = (key_equal *)&local_c8;
  raw_hash_set<phmap::priv::FlatHashSetPolicy<unsigned_int>,phmap::Hash<unsigned_int>,phmap::EqualTo<unsigned_int>,std::allocator<unsigned_int>>
  ::raw_hash_set<int_const*>
            ((raw_hash_set<phmap::priv::FlatHashSetPolicy<unsigned_int>,phmap::Hash<unsigned_int>,phmap::EqualTo<unsigned_int>,std::allocator<unsigned_int>>
              *)&st2,(int *)&gtest_ar_,local_98,0,(hasher *)&gtest_ar__1,eq_00,
             (allocator_type *)&local_c0);
  sVar1 = st2.
          super_raw_hash_set<phmap::priv::FlatHashSetPolicy<unsigned_int>,_phmap::Hash<unsigned_int>,_phmap::EqualTo<unsigned_int>,_std::allocator<unsigned_int>_>
          .size_;
  gtest_ar_ = (AssertionResult)
              raw_hash_set<phmap::priv::FlatHashSetPolicy<unsigned_int>,_phmap::Hash<unsigned_int>,_phmap::EqualTo<unsigned_int>,_std::allocator<unsigned_int>_>
              ::begin(&st2.
                       super_raw_hash_set<phmap::priv::FlatHashSetPolicy<unsigned_int>,_phmap::Hash<unsigned_int>,_phmap::EqualTo<unsigned_int>,_std::allocator<unsigned_int>_>
                     );
  pcVar2 = st2.
           super_raw_hash_set<phmap::priv::FlatHashSetPolicy<unsigned_int>,_phmap::Hash<unsigned_int>,_phmap::EqualTo<unsigned_int>,_std::allocator<unsigned_int>_>
           .ctrl_ + st2.
                    super_raw_hash_set<phmap::priv::FlatHashSetPolicy<unsigned_int>,_phmap::Hash<unsigned_int>,_phmap::EqualTo<unsigned_int>,_std::allocator<unsigned_int>_>
                    .capacity_;
  while ((ctrl_t *)gtest_ar_._0_8_ != pcVar2) {
    if (*(uint *)gtest_ar_.message_._M_t.
                 super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 .
                 super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                 ._M_head_impl < 3) {
      it_00.field_1 =
           (anon_union_8_1_a8a14541_for_iterator_1)
           gtest_ar_.message_._M_t.
           super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           .
           super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
           ._M_head_impl;
      it_00.ctrl_ = (ctrl_t *)gtest_ar_._0_8_;
      gtest_ar_ = (AssertionResult)
                  raw_hash_set<phmap::priv::FlatHashSetPolicy<unsigned_int>,_phmap::Hash<unsigned_int>,_phmap::EqualTo<unsigned_int>,_std::allocator<unsigned_int>_>
                  ::erase(&st2.
                           super_raw_hash_set<phmap::priv::FlatHashSetPolicy<unsigned_int>,_phmap::Hash<unsigned_int>,_phmap::EqualTo<unsigned_int>,_std::allocator<unsigned_int>_>
                          ,it_00);
    }
    else {
      raw_hash_set<phmap::priv::FlatHashSetPolicy<unsigned_int>,_phmap::Hash<unsigned_int>,_phmap::EqualTo<unsigned_int>,_std::allocator<unsigned_int>_>
      ::iterator::operator++((iterator *)&gtest_ar_);
    }
  }
  gtest_ar__1.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  gtest_ar__1.success_ =
       sVar1 - st2.
               super_raw_hash_set<phmap::priv::FlatHashSetPolicy<unsigned_int>,_phmap::Hash<unsigned_int>,_phmap::EqualTo<unsigned_int>,_std::allocator<unsigned_int>_>
               .size_ == 2;
  if (!gtest_ar__1.success_) {
    testing::Message::Message((Message *)&local_c8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_,(internal *)&gtest_ar__1,(AssertionResult *)"num_erased == 2",
               "false","true",(char *)eq_00);
    testing::internal::AssertHelper::AssertHelper
              (&local_c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/erase_if_test.cc"
               ,0x12,(char *)gtest_ar_._0_8_);
    testing::internal::AssertHelper::operator=(&local_c0,(Message *)&local_c8);
    testing::internal::AssertHelper::~AssertHelper(&local_c0);
    std::__cxx11::string::~string((string *)&gtest_ar_);
    if (local_c8.data_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_c8.data_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar__1.message_);
  gtest_ar__1.success_ =
       operator==(&st1.
                   super_raw_hash_set<phmap::priv::FlatHashSetPolicy<unsigned_int>,_phmap::Hash<unsigned_int>,_phmap::EqualTo<unsigned_int>,_std::allocator<unsigned_int>_>
                  ,&st2.
                    super_raw_hash_set<phmap::priv::FlatHashSetPolicy<unsigned_int>,_phmap::Hash<unsigned_int>,_phmap::EqualTo<unsigned_int>,_std::allocator<unsigned_int>_>
                 );
  gtest_ar__1.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  if (!gtest_ar__1.success_) {
    testing::Message::Message((Message *)&local_c8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_,(internal *)&gtest_ar__1,(AssertionResult *)"st1 == st2","false"
               ,"true",(char *)eq_00);
    testing::internal::AssertHelper::AssertHelper
              (&local_c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/erase_if_test.cc"
               ,0x14,(char *)gtest_ar_._0_8_);
    testing::internal::AssertHelper::operator=(&local_c0,(Message *)&local_c8);
    testing::internal::AssertHelper::~AssertHelper(&local_c0);
    std::__cxx11::string::~string((string *)&gtest_ar_);
    if (local_c8.data_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_c8.data_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar__1.message_);
  raw_hash_set<phmap::priv::FlatHashSetPolicy<unsigned_int>,_phmap::Hash<unsigned_int>,_phmap::EqualTo<unsigned_int>,_std::allocator<unsigned_int>_>
  ::~raw_hash_set(&st2.
                   super_raw_hash_set<phmap::priv::FlatHashSetPolicy<unsigned_int>,_phmap::Hash<unsigned_int>,_phmap::EqualTo<unsigned_int>,_std::allocator<unsigned_int>_>
                 );
  raw_hash_set<phmap::priv::FlatHashSetPolicy<unsigned_int>,_phmap::Hash<unsigned_int>,_phmap::EqualTo<unsigned_int>,_std::allocator<unsigned_int>_>
  ::~raw_hash_set(&st1.
                   super_raw_hash_set<phmap::priv::FlatHashSetPolicy<unsigned_int>,_phmap::Hash<unsigned_int>,_phmap::EqualTo<unsigned_int>,_std::allocator<unsigned_int>_>
                 );
  return;
}

Assistant:

TEST(EraseIf, FlatHashSet_uint32) {
    phmap::flat_hash_set<uint32_t> st1 = { 3, 6, 7, 9 };
    auto num_erased = erase_if(st1, [](const uint32_t& v) { return v >= 7; });
    EXPECT_TRUE(num_erased == 2);

    phmap::flat_hash_set<uint32_t> st2 = { 0, 2, 3, 6 };
    num_erased = erase_if(st2, [](const uint32_t& v) { return v <= 2; });
    EXPECT_TRUE(num_erased == 2);

    EXPECT_TRUE(st1 == st2);
}